

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O3

XMLCh * __thiscall
PSVIWriterHandlers::translateValueConstraint
          (PSVIWriterHandlers *this,VALUE_CONSTRAINT constraintKind)

{
  XMLCh *pXVar1;
  
  if (constraintKind == VALUE_CONSTRAINT_FIXED) {
    pXVar1 = (XMLCh *)&xercesc_4_0::PSVIUni::fgVCFixed;
  }
  else {
    pXVar1 = (XMLCh *)&xercesc_4_0::PSVIUni::fgUnknown;
  }
  if (constraintKind == VALUE_CONSTRAINT_DEFAULT) {
    pXVar1 = (XMLCh *)&xercesc_4_0::PSVIUni::fgDefault;
  }
  return pXVar1;
}

Assistant:

const XMLCh* PSVIWriterHandlers::translateValueConstraint(XSConstants::VALUE_CONSTRAINT constraintKind) {
	switch (constraintKind) {
		case XSConstants::VALUE_CONSTRAINT_DEFAULT :
			return PSVIUni::fgDefault;
		case XSConstants::VALUE_CONSTRAINT_FIXED :
			return PSVIUni::fgVCFixed;
		default :
			return PSVIUni::fgUnknown;
	}
}